

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

int stbir__resize_arbitrary
              (void *alloc_context,void *input_data,int input_w,int input_h,
              int input_stride_in_bytes,void *output_data,int output_w,int output_h,
              int output_stride_in_bytes,float s0,float t0,float s1,float t1,float *transform,
              int channels,int alpha_channel,stbir_uint32 flags,stbir_datatype type,
              stbir_filter h_filter,stbir_filter v_filter,stbir_edge edge_horizontal,
              stbir_edge edge_vertical,stbir_colorspace colorspace)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  float scale;
  stbir_datatype filter;
  stbir_filter filter_00;
  stbir__contributors *contributors;
  stbir_uint32 sVar5;
  stbir_uint32 sVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  undefined4 in_register_00000084;
  ulong uVar20;
  int c_1;
  ulong uVar21;
  long lVar22;
  int iVar23;
  stbir__contributors *contributors_00;
  void *pvVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 in_stack_0000001c;
  int local_1a8;
  int out_first_scanline;
  float *local_1a0;
  void *local_198;
  int local_18c;
  long local_188;
  ulong local_180;
  long local_178;
  float *local_170;
  float *local_168;
  float *local_160;
  float local_158;
  float out_center_of_in;
  undefined1 local_150 [64];
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  uint local_104;
  int local_100;
  uint local_fc;
  stbir_datatype local_f8;
  stbir_datatype local_f4;
  stbir_filter local_f0;
  stbir_edge local_ec;
  stbir_edge local_e8;
  stbir_colorspace local_e4;
  stbir__contributors *local_e0;
  float *local_d8;
  stbir__contributors *local_d0;
  float *local_c8;
  int local_c0;
  float *local_b8;
  float *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_88;
  int local_84;
  undefined8 local_80;
  int local_78;
  float *local_70;
  float *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  stbir__contributors *local_40;
  long local_38;
  
  local_150._8_4_ = SUB84(input_data,0);
  local_150._32_4_ = SUB84(output_data,0);
  local_150._36_4_ = output_w;
  local_104 = (uint)transform;
  if ((undefined1 (*) [16])CONCAT44(in_stack_0000001c,output_stride_in_bytes) ==
      (undefined1 (*) [16])0x0) {
    auVar26._12_4_ = (float)output_w;
    auVar26._8_4_ = (float)(int)local_150._32_4_;
    auVar26._4_4_ = 0;
    auVar26._0_4_ = output_w;
    auVar28._4_4_ = (float)output_w * t0;
    auVar28._0_4_ = (float)(int)local_150._32_4_ * s0;
    auVar27._4_4_ = t0;
    auVar27._0_4_ = s0;
    auVar27._8_4_ = (float)(int)local_150._8_4_;
    auVar27._12_4_ = (float)input_w;
    auVar27 = divps(auVar26,auVar27);
    auVar28._8_8_ = auVar27._8_8_;
    auVar1._4_4_ = t1 - t0;
    auVar1._0_4_ = s1 - s0;
    auVar1._8_4_ = s1 - s0;
    auVar1._12_4_ = t1 - t0;
    register0x00001300 = divps(auVar28,auVar1);
  }
  else {
    auVar27 = *(undefined1 (*) [16])CONCAT44(in_stack_0000001c,output_stride_in_bytes);
    register0x00001300 = auVar27._8_8_;
    fStack_10c = (float)auVar27._0_4_;
    fStack_108 = (float)auVar27._4_4_;
  }
  local_f4 = local_150._68_4_ <= 1.0 | STBIR_MAX_TYPES;
  if (type != STBIR_TYPE_UINT8) {
    local_f4 = type;
  }
  local_f0 = local_150._72_4_ <= 1.0 | STBIR_FILTER_CATMULLROM;
  if (h_filter != STBIR_FILTER_DEFAULT) {
    local_f0 = h_filter;
  }
  local_150._12_4_ = input_w;
  local_150._44_4_ = s0;
  local_150._48_4_ = t0;
  local_150._52_4_ = s1;
  local_150._56_4_ = t1;
  sVar5 = stbir__calculate_memory((stbir__info *)local_150);
  uVar16 = (ulong)sVar5;
  local_40 = (stbir__contributors *)malloc(uVar16);
  if (local_40 == (stbir__contributors *)0x0) {
    local_18c = 0;
  }
  else {
    sVar6 = stbir__calculate_memory((stbir__info *)local_150);
    contributors = local_40;
    filter_00 = local_f0;
    filter = local_f4;
    uVar3 = local_104;
    if (input_h == 0) {
      input_h = (uint)"\x01\x02\x04\x04"[flags] * local_150._8_4_ * local_104;
    }
    if (output_h == 0) {
      output_h = (uint)"\x01\x02\x04\x04"[flags] * local_150._32_4_ * local_104;
    }
    if ((int)local_104 < 0) {
      __assert_fail("info->channels >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x912,
                    "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                   );
    }
    if (0x40 < local_104) {
      __assert_fail("info->channels <= 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x913,
                    "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                   );
    }
    if ((STBIR_MAX_TYPES|STBIR_TYPE_UINT16) < local_f4) {
      __assert_fail("info->horizontal_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x918,
                    "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                   );
    }
    uVar21 = (ulong)local_f0;
    local_198 = alloc_context;
    if (5 < uVar21) {
      __assert_fail("info->vertical_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x919,
                    "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                   );
    }
    uVar2 = alpha_channel | 3;
    if (-1 < channels) {
      uVar2 = alpha_channel;
    }
    if (((~uVar2 & 3) != 0) && ((channels < 0 || (local_104 <= (uint)channels)))) {
      __assert_fail("alpha_channel >= 0 && alpha_channel < info->channels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                    ,0x924,
                    "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                   );
    }
    local_18c = 0;
    if (channels < (int)local_104) {
      if (sVar5 < sVar6) {
        __assert_fail("tempmem_size_in_bytes >= memory_required",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                      ,0x92e,
                      "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                     );
      }
      memset(local_40,0,uVar16);
      local_150._0_8_ = local_198;
      local_100 = channels;
      local_f8 = flags;
      local_ec = v_filter;
      local_e8 = edge_horizontal;
      local_e4 = edge_vertical;
      fVar25 = fStack_10c;
      local_150._16_4_ = input_h;
      local_150._24_8_ = (float *)CONCAT44(in_register_00000084,input_stride_in_bytes);
      local_150._40_4_ = output_h;
      local_fc = uVar2;
      local_a8 = stbir__get_coefficient_width(filter,fStack_10c);
      scale = fStack_108;
      local_a4 = stbir__get_coefficient_width(filter_00,fStack_108);
      local_a0 = stbir__get_filter_pixel_width(filter,fVar25);
      local_9c = stbir__get_filter_pixel_width(filter_00,scale);
      iVar7 = stbir__get_filter_pixel_margin(filter,fVar25);
      local_98 = iVar7;
      iVar8 = stbir__get_filter_pixel_margin(filter_00,scale);
      local_88 = uVar3 * local_150._32_4_ * 4;
      local_c0 = local_150._8_4_ + iVar7 * 2;
      local_e0 = contributors;
      local_d8 = (float *)((long)&contributors->n0 + (long)local_60);
      contributors_00 = (stbir__contributors *)((long)local_5c + (long)local_d8);
      pfVar9 = (float *)((long)&contributors_00->n0 + (long)local_58);
      local_b8 = (float *)((long)local_54 + (long)pfVar9);
      lVar11 = (long)&contributors->n0 + uVar16;
      local_d0 = contributors_00;
      local_c8 = pfVar9;
      local_94 = iVar8;
      if (1.0 < scale) {
        local_b0 = (float *)0x0;
        local_70 = (float *)((long)local_b8 + (long)local_50);
        local_68 = (float *)((long)local_48 + (long)local_70);
        if (lVar11 != (long)local_44 + (long)local_68) {
          __assert_fail("(size_t)(unsigned char*)(((unsigned char*)info->encode_buffer) + info->encode_buffer_size) == (size_t)tempmem + tempmem_size_in_bytes"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                        ,0x95a,
                        "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                       );
        }
      }
      else {
        local_b0 = (float *)((long)local_b8 + (long)local_50);
        local_70 = (float *)((long)local_4c + (long)local_b0);
        local_68 = (float *)0x0;
        if (lVar11 != (long)local_48 + (long)local_70) {
          __assert_fail("(size_t)(unsigned char*)(((unsigned char*)info->ring_buffer) + info->ring_buffer_size) == (size_t)tempmem + tempmem_size_in_bytes"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                        ,0x962,
                        "int stbir__resize_allocated(stbir__info *, const void *, int, void *, int, int, stbir_uint32, stbir_datatype, stbir_edge, stbir_edge, stbir_colorspace, void *, size_t)"
                       );
        }
      }
      local_78 = -1;
      stbir__calculate_filters
                (contributors,local_d8,filter,fVar25,(float)local_150._60_4_,local_150._8_4_,
                 local_150._32_4_);
      uVar4 = local_150._12_4_;
      local_188 = CONCAT44(local_188._4_4_,local_150._36_4_);
      stbir__calculate_filters
                (contributors_00,pfVar9,filter_00,scale,fStack_110,local_150._12_4_,local_150._36_4_
                );
      local_18c = 1;
      if (1.0 < scale) {
        local_158 = (*stbir__filter_info_table[uVar21].support)(1.0 / scale);
        local_158 = local_158 * scale;
        pvVar24 = (void *)0x0;
        iVar7 = (int)local_188;
        while ((long)pvVar24 < (long)iVar7) {
          out_first_scanline = 0;
          local_1a8 = 0;
          stbir__calculate_sample_range_upsample
                    ((int)pvVar24,local_158,scale,fStack_110,&out_first_scanline,&local_1a8,
                     &out_center_of_in);
          iVar7 = local_1a8;
          if (local_84 <= local_1a8 - out_first_scanline) {
            __assert_fail("in_last_scanline - in_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                          ,0x828,"void stbir__buffer_loop_upsample(stbir__info *)");
          }
          iVar8 = out_first_scanline;
          if (-1 < local_78) {
            iVar17 = local_80._4_4_;
            iVar19 = (int)local_80;
            while (iVar19 < out_first_scanline) {
              if (iVar17 == iVar19) {
                local_78 = -1;
                local_80._0_4_ = 0;
                local_80._4_4_ = 0;
                goto LAB_00112142;
              }
              iVar19 = iVar19 + 1;
              local_80._0_4_ = iVar19;
              local_78 = (local_78 + 1) % local_84;
            }
            if (-1 < local_78) goto LAB_0011214a;
          }
LAB_00112142:
          while( true ) {
            stbir__decode_and_resample_upsample((stbir__info *)local_150,iVar8);
LAB_0011214a:
            pfVar14 = local_68;
            pfVar9 = local_70;
            iVar8 = local_84;
            uVar3 = local_104;
            uVar4 = local_150._32_4_;
            if (iVar7 <= local_80._4_4_) break;
            iVar8 = local_80._4_4_ + 1;
          }
          if (fStack_108 <= 1.0) {
            __assert_fail("stbir__use_height_upsampling(stbir_info)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                          ,0x773,"void stbir__resample_vertical_upsample(stbir__info *, int)");
          }
          local_1a0 = local_c8;
          lVar22 = (long)(int)local_104;
          local_160 = (float *)CONCAT44(local_160._4_4_,local_100);
          local_170 = (float *)(ulong)local_f8;
          local_180 = (ulong)local_e4;
          local_168 = (float *)local_150._24_8_;
          iVar23 = local_88 >> 2;
          local_188 = (long)(int)pvVar24;
          local_38 = local_a4 * local_188;
          iVar7 = local_d0[(long)pvVar24].n1;
          iVar17 = local_d0[(long)pvVar24].n0;
          iVar19 = local_78 - (int)local_80;
          local_178 = (long)(int)local_150._40_4_;
          local_198 = pvVar24;
          memset(local_68,0,(int)local_150._32_4_ * lVar22 * 4);
          lVar11 = (long)(int)local_38;
          switch(uVar3) {
          case 1:
            uVar16 = 0;
            if (0 < (int)uVar4) {
              uVar16 = (ulong)(uint)uVar4;
            }
            lVar22 = 0;
            for (; iVar17 <= iVar7; iVar17 = iVar17 + 1) {
              fVar25 = local_1a0[lVar11 + lVar22];
              for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                pfVar14[uVar21] =
                     pfVar9[(long)(((iVar17 + iVar19) % iVar8) * iVar23) + uVar21] * fVar25 +
                     pfVar14[uVar21];
              }
              lVar22 = lVar22 + 1;
            }
            break;
          case 2:
            uVar16 = 0;
            if (0 < (int)uVar4) {
              uVar16 = (ulong)(uint)uVar4;
            }
            lVar22 = 0;
            for (; iVar17 <= iVar7; iVar17 = iVar17 + 1) {
              lVar12 = (long)(((iVar17 + iVar19) % iVar8) * iVar23);
              fVar25 = local_1a0[lVar11 + lVar22];
              for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                pfVar14[uVar21 * 2] = pfVar9[lVar12 + uVar21 * 2] * fVar25 + pfVar14[uVar21 * 2];
                pfVar14[uVar21 * 2 + 1] =
                     pfVar9[lVar12 + uVar21 * 2 + 1] * fVar25 + pfVar14[uVar21 * 2 + 1];
              }
              lVar22 = lVar22 + 1;
            }
            break;
          case 3:
            uVar16 = 0;
            if (0 < (int)uVar4) {
              uVar16 = (ulong)(uint)uVar4;
            }
            lVar22 = 0;
            for (; iVar17 <= iVar7; iVar17 = iVar17 + 1) {
              fVar25 = local_1a0[lVar11 + lVar22];
              lVar12 = (long)(((iVar17 + iVar19) % iVar8) * iVar23) * 4;
              for (lVar13 = 0; uVar16 * 0xc - lVar13 != 0; lVar13 = lVar13 + 0xc) {
                *(float *)((long)pfVar14 + lVar13) =
                     *(float *)((long)pfVar9 + lVar13 + lVar12) * fVar25 +
                     *(float *)((long)pfVar14 + lVar13);
                *(float *)((long)pfVar14 + lVar13 + 4) =
                     *(float *)((long)pfVar9 + lVar13 + lVar12 + 4) * fVar25 +
                     *(float *)((long)pfVar14 + lVar13 + 4);
                *(float *)((long)pfVar14 + lVar13 + 8) =
                     *(float *)((long)pfVar9 + lVar13 + lVar12 + 8) * fVar25 +
                     *(float *)((long)pfVar14 + lVar13 + 8);
              }
              lVar22 = lVar22 + 1;
            }
            break;
          case 4:
            uVar16 = 0;
            if (0 < (int)uVar4) {
              uVar16 = (ulong)(uint)uVar4;
            }
            lVar11 = 0;
            for (; iVar17 <= iVar7; iVar17 = iVar17 + 1) {
              fVar25 = local_1a0[local_38 + lVar11];
              lVar22 = (long)(((iVar17 + iVar19) % iVar8) * iVar23) * 4;
              for (lVar12 = 0; uVar16 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
                *(float *)((long)pfVar14 + lVar12) =
                     *(float *)((long)pfVar9 + lVar12 + lVar22) * fVar25 +
                     *(float *)((long)pfVar14 + lVar12);
                *(float *)((long)pfVar14 + lVar12 + 4) =
                     *(float *)((long)pfVar9 + lVar12 + lVar22 + 4) * fVar25 +
                     *(float *)((long)pfVar14 + lVar12 + 4);
                *(float *)((long)pfVar14 + lVar12 + 8) =
                     *(float *)((long)pfVar9 + lVar12 + lVar22 + 8) * fVar25 +
                     *(float *)((long)pfVar14 + lVar12 + 8);
                *(float *)((long)pfVar14 + lVar12 + 0xc) =
                     *(float *)((long)pfVar9 + lVar12 + lVar22 + 0xc) * fVar25 +
                     *(float *)((long)pfVar14 + lVar12 + 0xc);
              }
              lVar11 = lVar11 + 1;
            }
            break;
          default:
            uVar16 = 0;
            if (0 < (int)uVar3) {
              uVar16 = (ulong)uVar3;
            }
            uVar21 = 0;
            if (0 < (int)uVar4) {
              uVar21 = (ulong)(uint)uVar4;
            }
            lVar12 = 0;
            for (; iVar17 <= iVar7; iVar17 = iVar17 + 1) {
              pfVar10 = pfVar9 + ((iVar17 + iVar19) % iVar8) * iVar23;
              fVar25 = local_1a0[lVar11 + lVar12];
              pfVar15 = pfVar14;
              for (uVar20 = 0; uVar20 != uVar21; uVar20 = uVar20 + 1) {
                for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
                  pfVar15[uVar18] = pfVar10[uVar18] * fVar25 + pfVar15[uVar18];
                }
                pfVar15 = pfVar15 + lVar22;
                pfVar10 = pfVar10 + lVar22;
              }
              lVar12 = lVar12 + 1;
            }
          }
          stbir__encode_scanline
                    ((stbir__info *)local_150,uVar4,
                     (float *)((long)local_168 + local_178 * local_188),pfVar14,uVar3,(int)local_160
                     ,(int)local_180 + (int)local_170 * 2);
          iVar7 = local_150._36_4_;
          pvVar24 = (void *)((long)local_198 + 1);
        }
      }
      else {
        fVar25 = (*stbir__filter_info_table[uVar21].support)(scale);
        local_178 = CONCAT44(local_178._4_4_,fVar25 / scale);
        iVar17 = -iVar8;
        iVar7 = uVar4 + iVar8;
        if (uVar4 + iVar8 < iVar17) {
          iVar7 = iVar17;
        }
        local_1a0 = (float *)CONCAT44(local_1a0._4_4_,iVar7);
        while (iVar17 != iVar7) {
          local_180 = CONCAT44(local_180._4_4_,iVar17);
          stbir__calculate_sample_range_downsample
                    (iVar17,(float)local_178,scale,fStack_110,&out_first_scanline,&local_1a8,
                     &out_center_of_in);
          iVar8 = out_first_scanline;
          iVar7 = local_1a8;
          if (local_84 <= local_1a8 - out_first_scanline) {
            __assert_fail("out_last_scanline - out_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                          ,0x88d,"void stbir__buffer_loop_downsample(stbir__info *)");
          }
          if (out_first_scanline < (int)local_188 && -1 < local_1a8) {
            stbir__empty_ring_buffer((stbir__info *)local_150,out_first_scanline);
            iVar17 = (int)local_180;
            stbir__decode_scanline((stbir__info *)local_150,(int)local_180);
            pfVar9 = local_b0;
            memset(local_b0,0,(long)(int)local_104 * (long)(int)local_150._32_4_ * 4);
            if (1.0 < fStack_10c) {
              stbir__resample_horizontal_upsample((stbir__info *)local_150,pfVar9);
            }
            else {
              stbir__resample_horizontal_downsample((stbir__info *)local_150,pfVar9);
            }
            if (-1 < local_78) goto LAB_00111d95;
            while( true ) {
              stbir__add_empty_ring_buffer_entry((stbir__info *)local_150,iVar8);
LAB_00111d95:
              if (iVar7 <= local_80._4_4_) break;
              iVar8 = local_80._4_4_ + 1;
            }
            if (1.0 < fStack_108) {
              __assert_fail("!stbir__use_height_upsampling(stbir_info)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                            ,0x7de,"void stbir__resample_vertical_downsample(stbir__info *, int)");
            }
            lVar11 = (long)iVar17 + (long)local_94;
            iVar7 = local_d0[lVar11].n0;
            lVar22 = (long)iVar7;
            local_198 = (void *)(ulong)(uint)(local_78 - (int)local_80);
            uVar3 = local_150._32_4_;
            if ((int)local_150._32_4_ < 1) {
              uVar3 = 0;
            }
            uVar21 = (ulong)uVar3;
            uVar16 = 0;
            if (0 < (int)local_104) {
              uVar16 = (ulong)local_104;
            }
            iVar8 = local_d0[lVar11].n1;
            local_160 = local_70 + 3;
            local_168 = local_70 + 2;
            local_170 = local_70 + 1;
            for (; lVar22 <= iVar8; lVar22 = lVar22 + 1) {
              fVar25 = local_c8[(local_a4 * (int)lVar11 - iVar7) + (int)lVar22];
              lVar12 = (long)((((local_78 - (int)local_80) + (int)lVar22) % local_84) *
                             (local_88 >> 2));
              pfVar9 = local_70 + lVar12;
              switch(local_104) {
              case 1:
                for (uVar20 = 0; uVar21 != uVar20; uVar20 = uVar20 + 1) {
                  pfVar9[uVar20] = local_b0[uVar20] * fVar25 + pfVar9[uVar20];
                }
                break;
              case 2:
                for (uVar20 = 0; uVar21 != uVar20; uVar20 = uVar20 + 1) {
                  local_170[lVar12 + uVar20 * 2 + -1] =
                       local_b0[uVar20 * 2] * fVar25 + local_170[lVar12 + uVar20 * 2 + -1];
                  local_170[lVar12 + uVar20 * 2] =
                       local_b0[uVar20 * 2 + 1] * fVar25 + local_170[lVar12 + uVar20 * 2];
                }
                break;
              case 3:
                for (lVar13 = 0; uVar21 * 0xc - lVar13 != 0; lVar13 = lVar13 + 0xc) {
                  *(float *)((long)local_168 + lVar13 + lVar12 * 4 + -8) =
                       *(float *)((long)local_b0 + lVar13) * fVar25 +
                       *(float *)((long)local_168 + lVar13 + lVar12 * 4 + -8);
                  *(float *)((long)local_168 + lVar13 + lVar12 * 4 + -4) =
                       *(float *)((long)local_b0 + lVar13 + 4) * fVar25 +
                       *(float *)((long)local_168 + lVar13 + lVar12 * 4 + -4);
                  *(float *)((long)local_168 + lVar13 + lVar12 * 4) =
                       *(float *)((long)local_b0 + lVar13 + 8) * fVar25 +
                       *(float *)((long)local_168 + lVar13 + lVar12 * 4);
                }
                break;
              case 4:
                for (lVar13 = 0; uVar21 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
                  *(float *)((long)local_160 + lVar13 + lVar12 * 4 + -0xc) =
                       *(float *)((long)local_b0 + lVar13) * fVar25 +
                       *(float *)((long)local_160 + lVar13 + lVar12 * 4 + -0xc);
                  *(float *)((long)local_160 + lVar13 + lVar12 * 4 + -8) =
                       *(float *)((long)local_b0 + lVar13 + 4) * fVar25 +
                       *(float *)((long)local_160 + lVar13 + lVar12 * 4 + -8);
                  *(float *)((long)local_160 + lVar13 + lVar12 * 4 + -4) =
                       *(float *)((long)local_b0 + lVar13 + 8) * fVar25 +
                       *(float *)((long)local_160 + lVar13 + lVar12 * 4 + -4);
                  *(float *)((long)local_160 + lVar13 + lVar12 * 4) =
                       *(float *)((long)local_b0 + lVar13 + 0xc) * fVar25 +
                       *(float *)((long)local_160 + lVar13 + lVar12 * 4);
                }
                break;
              default:
                pfVar14 = local_b0;
                for (uVar20 = 0; uVar20 != uVar21; uVar20 = uVar20 + 1) {
                  for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
                    pfVar9[uVar18] = pfVar14[uVar18] * fVar25 + pfVar9[uVar18];
                  }
                  pfVar9 = pfVar9 + (int)local_104;
                  pfVar14 = pfVar14 + (int)local_104;
                }
              }
            }
          }
          iVar7 = (int)local_1a0;
          iVar17 = (int)local_180 + 1;
        }
        stbir__empty_ring_buffer((stbir__info *)local_150,local_150._36_4_);
      }
    }
    free(local_40);
  }
  return local_18c;
}

Assistant:

static int stbir__resize_arbitrary(
    void *alloc_context,
    const void* input_data, int input_w, int input_h, int input_stride_in_bytes,
    void* output_data, int output_w, int output_h, int output_stride_in_bytes,
    float s0, float t0, float s1, float t1, float *transform,
    int channels, int alpha_channel, stbir_uint32 flags, stbir_datatype type,
    stbir_filter h_filter, stbir_filter v_filter,
    stbir_edge edge_horizontal, stbir_edge edge_vertical, stbir_colorspace colorspace)
{
    stbir__info info;
    int result;
    size_t memory_required;
    void* extra_memory;

    stbir__setup(&info, input_w, input_h, output_w, output_h, channels);
    stbir__calculate_transform(&info, s0,t0,s1,t1,transform);
    stbir__choose_filter(&info, h_filter, v_filter);
    memory_required = stbir__calculate_memory(&info);
    extra_memory = STBIR_MALLOC(memory_required, alloc_context);

    if (!extra_memory)
        return 0;

    result = stbir__resize_allocated(&info, input_data, input_stride_in_bytes,
                                            output_data, output_stride_in_bytes,
                                            alpha_channel, flags, type,
                                            edge_horizontal, edge_vertical,
                                            colorspace, extra_memory, memory_required);

    STBIR_FREE(extra_memory, alloc_context);

    return result;
}